

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O1

void asio::detail::
     reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  code *pcVar1;
  ptr p;
  binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
  handler;
  handler_work<std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor,_void>
  w;
  ptr local_b0;
  _Any_data local_98;
  code *local_88;
  scheduler_operation *local_80;
  scheduler_operation *local_78;
  func_type p_Stack_70;
  scheduler_operation *local_68;
  any_executor_base local_58;
  func_type local_28;
  
  local_b0.h = (function<void_(const_std::error_code_&,_unsigned_long)> *)(base + 4);
  local_b0.v = (reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
                *)base;
  local_b0.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
                *)base;
  execution::detail::any_executor_base::any_executor_base
            (&local_58,(any_executor_base *)&base[5].func_);
  local_28 = base[7].func_;
  base[7].func_ =
       (func_type)
       execution::
       any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
       ::prop_fns_table<void>()::fns;
  local_98._M_unused._M_object = (scheduler_operation *)0x0;
  local_98._8_8_ = (func_type)0x0;
  local_88 = (code *)0x0;
  local_80 = base[5].next_;
  pcVar1 = *(code **)&base[4].task_result_;
  if (pcVar1 != (code *)0x0) {
    local_98._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)
          &(((function<void_(const_std::error_code_&,_unsigned_long)> *)(base + 4))->
           super__Function_base)._M_functor;
    local_98._8_8_ = base[4].func_;
    *(undefined8 *)&base[4].task_result_ = 0;
    base[5].next_ = (scheduler_operation *)0x0;
    local_88 = pcVar1;
  }
  local_78 = base[1].next_;
  p_Stack_70 = base[1].func_;
  local_b0.h = (function<void_(const_std::error_code_&,_unsigned_long)> *)&local_98;
  local_68 = base[2].next_;
  ptr::reset(&local_b0);
  if (owner != (void *)0x0) {
    if (local_58.target_ == (void *)0x0) {
      binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
      ::operator()((binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
                    *)&local_98);
    }
    else {
      execution::detail::any_executor_base::
      execute<asio::detail::binder2<std::function<void(std::error_code_const&,unsigned_long)>,std::error_code,unsigned_long>>
                (&local_58,
                 (binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
                  *)&local_98);
    }
  }
  if (local_88 != (code *)0x0) {
    (*local_88)((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  if (local_58.target_ != (void *)0x0) {
    (*(local_58.object_fns_)->destroy)(&local_58);
  }
  ptr::reset(&local_b0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    ASIO_ASSUME(base != 0);
    reactive_socket_recv_op* o(static_cast<reactive_socket_recv_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        static_cast<handler_work<Handler, IoExecutor>&&>(
          o->work_));

    ASIO_ERROR_LOCATION(o->ec_);

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }